

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

Var Js::JavascriptOperators::OP_GetInstanceScoped
              (FrameDisplay *pScope,PropertyId propertyId,Var rootObject,Var *thisVar,
              ScriptContext *scriptContext)

{
  ushort uVar1;
  BOOL BVar2;
  int iVar3;
  RecyclableObject *instance;
  GlobalObject *pGVar4;
  undefined4 extraout_var;
  uint index;
  
  uVar1 = pScope->length;
  if (uVar1 != 0) {
    index = 0;
    do {
      instance = (RecyclableObject *)FrameDisplay::GetItem(pScope,index);
      BVar2 = HasProperty(instance,propertyId);
      if (BVar2 != 0) {
        iVar3 = (*(instance->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x42])(instance,thisVar);
        return (Var)CONCAT44(extraout_var,iVar3);
      }
      index = index + 1;
    } while (uVar1 != index);
  }
  *thisVar = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
  pGVar4 = (scriptContext->super_ScriptContextBase).globalObject;
  if (pGVar4 != (GlobalObject *)rootObject) {
    BVar2 = OP_HasProperty(rootObject,propertyId,scriptContext);
    pGVar4 = (GlobalObject *)rootObject;
    if (BVar2 == 0) {
      pGVar4 = (scriptContext->super_ScriptContextBase).globalObject;
    }
  }
  return pGVar4;
}

Assistant:

Var JavascriptOperators::OP_GetInstanceScoped(FrameDisplay *pScope, PropertyId propertyId, Var rootObject, Var* thisVar, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_GetInstanceScoped);
        // Similar to GetPropertyScoped, but instead of returning the property value, we return the instance that
        // owns it, or the global object if no instance is found.

        int i;
        int length = pScope->GetLength();

        for (i = 0; i < length; i++)
        {
            RecyclableObject *obj = (RecyclableObject*)pScope->GetItem(i);

            if (JavascriptOperators::HasProperty(obj, propertyId))
            {
                // HasProperty will call UnscopablesWrapperObject's HasProperty which will do the filtering
                // All we have to do here is unwrap the object hence the api call

                return obj->GetThisAndUnwrappedInstance(thisVar);
            }
        }

        *thisVar = scriptContext->GetLibrary()->GetUndefined();
        if (rootObject != scriptContext->GetGlobalObject())
        {
            if (JavascriptOperators::OP_HasProperty(rootObject, propertyId, scriptContext))
            {
                return rootObject;
            }
        }

        return scriptContext->GetGlobalObject();
        JIT_HELPER_END(Op_GetInstanceScoped);
    }